

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XMLUri::serialize(XMLUri *this,XSerializeEngine *serEng)

{
  XMLSize_t dummyDataLen;
  XMLSize_t dummyBufferLen;
  XMLSize_t local_20;
  XMLSize_t local_18;
  
  if (serEng->fStoreLoad != 0) {
    XSerializeEngine::operator>>(serEng,&this->fPort);
    XSerializeEngine::readString(serEng,&this->fScheme,&local_18,&local_20,false);
    XSerializeEngine::readString(serEng,&this->fUserInfo,&local_18,&local_20,false);
    XSerializeEngine::readString(serEng,&this->fHost,&local_18,&local_20,false);
    XSerializeEngine::readString(serEng,&this->fRegAuth,&local_18,&local_20,false);
    XSerializeEngine::readString(serEng,&this->fPath,&local_18,&local_20,false);
    XSerializeEngine::readString(serEng,&this->fQueryString,&local_18,&local_20,false);
    XSerializeEngine::readString(serEng,&this->fFragment,&local_18,&local_20,false);
    XSerializeEngine::readString(serEng,&this->fURIText,&local_18,&local_20,false);
    return;
  }
  XSerializeEngine::operator<<(serEng,this->fPort);
  XSerializeEngine::writeString(serEng,this->fScheme,0,false);
  XSerializeEngine::writeString(serEng,this->fUserInfo,0,false);
  XSerializeEngine::writeString(serEng,this->fHost,0,false);
  XSerializeEngine::writeString(serEng,this->fRegAuth,0,false);
  XSerializeEngine::writeString(serEng,this->fPath,0,false);
  XSerializeEngine::writeString(serEng,this->fQueryString,0,false);
  XSerializeEngine::writeString(serEng,this->fFragment,0,false);
  XSerializeEngine::writeString(serEng,this->fURIText,0,false);
  return;
}

Assistant:

void XMLUri::serialize(XSerializeEngine& serEng)
{

    if (serEng.isStoring())
    {
        serEng<<fPort;
        serEng.writeString(fScheme);
        serEng.writeString(fUserInfo);
        serEng.writeString(fHost);
        serEng.writeString(fRegAuth);
        serEng.writeString(fPath);
        serEng.writeString(fQueryString);
        serEng.writeString(fFragment);
        serEng.writeString(fURIText);
    }
    else
    {
        serEng>>fPort;
        serEng.readString(fScheme);
        serEng.readString(fUserInfo);
        serEng.readString(fHost);
        serEng.readString(fRegAuth);
        serEng.readString(fPath);
        serEng.readString(fQueryString);
        serEng.readString(fFragment);
        serEng.readString(fURIText);
    }

}